

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_reshape_3d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2)

{
  _Bool _Var1;
  int64_t iVar2;
  ggml_tensor *tensor;
  long in_RCX;
  long in_RDX;
  ggml_tensor *in_RSI;
  long in_R8;
  ggml_tensor *result;
  int64_t ne [3];
  size_t in_stack_00000160;
  ggml_tensor *in_stack_00000168;
  int64_t *in_stack_00000170;
  int in_stack_00000178;
  ggml_type in_stack_0000017c;
  ggml_context *in_stack_00000180;
  
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x14de77);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xc2d
               ,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  iVar2 = ggml_nelements(in_RSI);
  if (iVar2 != in_RDX * in_RCX * in_R8) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xc2e
               ,"GGML_ASSERT(%s) failed","ggml_nelements(a) == ne0*ne1*ne2");
  }
  tensor = ggml_new_tensor_impl
                     (in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
                      in_stack_00000168,in_stack_00000160);
  ggml_format_name(tensor,"%s (reshaped)",in_RSI->name);
  tensor->op = GGML_OP_RESHAPE;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_reshape_3d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0*ne1*ne2);

    const int64_t ne[3] = { ne0, ne1, ne2 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 3, ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}